

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scriptpubkeyman.cpp
# Opt level: O2

vector<CKeyID,_std::allocator<CKeyID>_> *
wallet::GetAffectedKeys
          (vector<CKeyID,_std::allocator<CKeyID>_> *__return_storage_ptr__,CScript *spk,
          SigningProvider *provider)

{
  _Rb_tree_header *p_Var1;
  _Base_ptr p_Var2;
  long in_FS_OFFSET;
  vector<CScript,_std::allocator<CScript>_> dummy;
  FlatSigningProvider out;
  undefined1 local_140 [24];
  undefined8 local_128;
  FlatSigningProvider local_118;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_128 = 0;
  local_140._8_8_ = 0;
  local_140._16_8_ = 0;
  local_118.scripts._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_118.scripts._M_t._M_impl.super__Rb_tree_header._M_header;
  local_118.super_SigningProvider._vptr_SigningProvider =
       (_func_int **)&PTR__FlatSigningProvider_00a2aa40;
  local_118.scripts._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_118.scripts._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_118.scripts._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &local_118.pubkeys._M_t._M_impl.super__Rb_tree_header;
  local_118.pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_118.pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_118.pubkeys._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_118.origins._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_118.origins._M_t._M_impl.super__Rb_tree_header._M_header;
  local_118.origins._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_118.origins._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_118.origins._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_118.keys._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_118.keys._M_t._M_impl.super__Rb_tree_header._M_header;
  local_118.keys._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_118.keys._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_118.keys._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_118.tr_trees._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_118.tr_trees._M_t._M_impl.super__Rb_tree_header._M_header;
  local_118.tr_trees._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_118.tr_trees._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_118.tr_trees._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_118.scripts._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_118.scripts._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_118.pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  local_118.pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  local_118.origins._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_118.origins._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_118.keys._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_118.keys._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_118.tr_trees._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_118.tr_trees._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  InferDescriptor((CScript *)local_140,(SigningProvider *)spk);
  (**(code **)(*(long *)local_140._0_8_ + 0x40))
            (local_140._0_8_,0,DUMMY_SIGNING_PROVIDER,local_140 + 8,&local_118,0);
  if ((long *)local_140._0_8_ != (long *)0x0) {
    (**(code **)(*(long *)local_140._0_8_ + 8))();
  }
  (__return_storage_ptr__->super__Vector_base<CKeyID,_std::allocator<CKeyID>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<CKeyID,_std::allocator<CKeyID>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<CKeyID,_std::allocator<CKeyID>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<CKeyID,_std::allocator<CKeyID>_>::reserve
            (__return_storage_ptr__,
             local_118.pubkeys._M_t._M_impl.super__Rb_tree_header._M_node_count);
  for (p_Var2 = local_118.pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var2 != p_Var1;
      p_Var2 = (_Base_ptr)std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var2)) {
    std::vector<CKeyID,_std::allocator<CKeyID>_>::push_back
              (__return_storage_ptr__,(value_type *)(p_Var2 + 1));
  }
  FlatSigningProvider::~FlatSigningProvider(&local_118);
  std::vector<CScript,_std::allocator<CScript>_>::~vector
            ((vector<CScript,_std::allocator<CScript>_> *)(local_140 + 8));
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

std::vector<CKeyID> GetAffectedKeys(const CScript& spk, const SigningProvider& provider)
{
    std::vector<CScript> dummy;
    FlatSigningProvider out;
    InferDescriptor(spk, provider)->Expand(0, DUMMY_SIGNING_PROVIDER, dummy, out);
    std::vector<CKeyID> ret;
    ret.reserve(out.pubkeys.size());
    for (const auto& entry : out.pubkeys) {
        ret.push_back(entry.first);
    }
    return ret;
}